

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_t1enc.c
# Opt level: O3

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt,jpc_enc_band_t *band,jpc_enc_cblk_t *cblk)

{
  jpc_enc_pass_t **ppjVar1;
  byte *pbVar2;
  jas_matrix_t *pjVar3;
  undefined8 uVar4;
  uint_fast16_t uVar5;
  uchar *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  jas_stream_t *pjVar15;
  jpc_mqenc_t *pjVar16;
  jpc_enc_pass_t *pjVar17;
  jas_matrix_t *pjVar18;
  jpc_bitstream_t *bitstream;
  ulong *puVar19;
  ulong uVar20;
  jpc_enc_pass_t *pjVar21;
  jpc_enc_pass_t *pjVar22;
  byte bVar23;
  uint uVar24;
  uint uVar25;
  jas_seqent_t *pjVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  jas_seqent_t *pjVar30;
  ulong uVar31;
  ulong *puVar32;
  jas_seqent_t *pjVar33;
  long lVar34;
  ulong *puVar35;
  jas_seqent_t *pjVar36;
  jas_seqent_t *pjVar37;
  int iVar38;
  char *pcVar39;
  long lVar40;
  long lVar41;
  jpc_fix_t *pjVar42;
  int iVar43;
  ulong *puVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  bool bVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  jas_seqent_t *local_160;
  jas_seqent_t *local_158;
  jpc_fix_t *local_150;
  jpc_fix_t *local_148;
  jas_seqent_t *local_140;
  int local_134;
  jas_seqent_t *local_130;
  jas_seqent_t *local_128;
  jas_seqent_t *local_120;
  jas_seqent_t *local_110;
  jas_seqent_t *local_100;
  jas_seqent_t *local_f8;
  jpc_fix_t *local_f0;
  jas_seqent_t *local_e8;
  jas_seqent_t *local_d8;
  jas_seqent_t *local_d0;
  ulong *local_c0;
  ulong *local_b8;
  jas_seqent_t *local_b0;
  jas_seqent_t *local_a8;
  jas_seqent_t *local_a0;
  jas_seqent_t *local_98;
  jas_seqent_t *local_88;
  jas_seqent_t *local_50;
  
  pjVar15 = jas_stream_memopen((char *)0x0,0);
  cblk->stream = pjVar15;
  if (pjVar15 == (jas_stream_t *)0x0) {
    __assert_fail("cblk->stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd1,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  pjVar16 = jpc_mqenc_create(0x13,pjVar15);
  cblk->mqenc = pjVar16;
  if (pjVar16 == (jpc_mqenc_t *)0x0) {
    __assert_fail("cblk->mqenc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xd3,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  jpc_mqenc_setctxs(pjVar16,0x13,jpc_mqctxs);
  uVar14 = cblk->numbps * 3 - 2;
  if (cblk->numbps < 1) {
    uVar14 = 0;
  }
  cblk->numpasses = uVar14;
  ppjVar1 = &cblk->passes;
  if (uVar14 == 0) {
    cblk->passes = (jpc_enc_pass_t *)0x0;
  }
  else {
    pjVar17 = (jpc_enc_pass_t *)jas_alloc2((ulong)uVar14,0x48);
    *ppjVar1 = pjVar17;
    if (pjVar17 == (jpc_enc_pass_t *)0x0) {
      __assert_fail("cblk->passes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                    ,0xd9,
                    "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
    }
    uVar28 = (ulong)cblk->numpasses;
    if (uVar28 != 0) {
      uVar14 = cblk->numpasses;
      uVar48 = tcmpt->cblksty;
      uVar49 = uVar48 & 1;
      iVar45 = 0;
      lVar34 = 0;
      do {
        *(undefined8 *)((long)&pjVar17->start + lVar34) = 0;
        iVar7 = JPC_ISTERMINATED(iVar45,0,uVar14,uVar48 >> 2 & 1,uVar49);
        *(int *)((long)&pjVar17->term + lVar34) = iVar7;
        iVar8 = JPC_SEGTYPE(iVar45,0,uVar49);
        *(int *)((long)&pjVar17->type + lVar34) = iVar8;
        *(undefined4 *)((long)&pjVar17->lyrno + lVar34) = 0xffffffff;
        if (uVar28 * 0x48 + -0x48 == lVar34) {
          if (iVar7 != 1) {
            __assert_fail("pass->term == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                          ,0xe5,
                          "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                         );
          }
          *(undefined4 *)((long)&pjVar17->term + lVar34) = 1;
        }
        lVar34 = lVar34 + 0x48;
        iVar45 = iVar45 + 1;
      } while (uVar28 * 0x48 != lVar34);
    }
  }
  pjVar18 = jas_matrix_create(cblk->data->numrows_ + 2,cblk->data->numcols_ + 2);
  cblk->flags = pjVar18;
  if (pjVar18 == (jas_matrix_t *)0x0) {
    __assert_fail("cblk->flags",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                  ,0xec,"int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                 );
  }
  pjVar17 = cblk->passes;
  if ((int)cblk->numpasses < 1) {
    bitstream = (jpc_bitstream_t *)0x0;
  }
  else {
    local_134 = cblk->numbps + -1;
    bitstream = (jpc_bitstream_t *)0x0;
    pjVar21 = pjVar17;
    uVar14 = cblk->numpasses;
    do {
      if (pjVar21->type != 1) {
        if (pjVar21->type != 2) {
          __assert_fail("pass->type == JPC_SEG_RAW",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0xf7,
                        "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                       );
        }
        if (bitstream == (jpc_bitstream_t *)0x0) {
          bitstream = jpc_bitstream_sopen(cblk->stream,"w");
          if (bitstream == (jpc_bitstream_t *)0x0) {
            return -1;
          }
          pjVar17 = *ppjVar1;
        }
      }
      lVar34 = jas_stream_tell(cblk->stream);
      pjVar21->start = (int)lVar34;
      if (local_134 < 0) {
        __assert_fail("bitpos >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                      ,0x108,
                      "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)");
      }
      lVar34 = (((long)pjVar21 - (long)pjVar17 >> 3) * -0x71c71c71c71c71c7 + 2) % 3;
      uVar48 = tcmpt->cblksty;
      uVar49 = uVar48 >> 3;
      iVar45 = pjVar21->term;
      iVar7 = (int)lVar34;
      bVar23 = (byte)local_134;
      if (iVar7 == 2) {
        if (pjVar21->type != 1) {
          __assert_fail("pass->type == JPC_SEG_MQ",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0x121,
                        "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                       );
        }
        pjVar16 = cblk->mqenc;
        pjVar18 = cblk->data;
        iVar7 = band->orient;
        pjVar3 = cblk->flags;
        pjVar21->nmsedec = 0;
        if (pjVar3->numrows_ < 2) {
          local_a8 = (jas_seqent_t *)0x0;
        }
        else {
          local_a8 = (jas_seqent_t *)((long)pjVar3->rows_[1] - (long)*pjVar3->rows_ >> 3);
        }
        iVar8 = (int)pjVar18->numcols_;
        uVar28 = pjVar18->numrows_;
        if ((long)uVar28 < 2) {
          local_b0._0_4_ = 0;
        }
        else {
          local_b0._0_4_ = (int)((long)pjVar18->rows_[1] - (long)*pjVar18->rows_ >> 3);
        }
        if (0 < (int)uVar28) {
          local_f0 = jpc_signmsedec;
          if (local_134 == 0) {
            local_f0 = jpc_signmsedec0;
          }
          local_b8 = (ulong *)*pjVar18->rows_;
          local_c0 = (ulong *)(pjVar3->rows_[1] + 1);
          iVar38 = (int)local_a8;
          lVar40 = (long)iVar38;
          uVar47 = iVar7 << 8;
          uVar27 = (ulong)(0x40 << (bVar23 & 0x1f));
          lVar41 = (long)(int)local_b0;
          uVar20 = (ulong)local_a8 & 0xffffffff;
          do {
            uVar12 = (uint)uVar28;
            uVar24 = 4;
            if (uVar12 < 4) {
              uVar24 = uVar12;
            }
            puVar32 = local_c0;
            puVar44 = local_b8;
            iVar7 = iVar8;
            if (0 < iVar8) {
              do {
                uVar28 = *puVar32;
                if ((((uVar12 < 4) || ((uVar28 & 0x50ff) != 0)) || ((puVar32[lVar40] & 0x50ff) != 0)
                    ) || (((puVar32[lVar40 * 2] & 0x50ff) != 0 ||
                          ((puVar32[lVar40 * 3] & 0x50ff) != 0)))) {
                  puVar35 = puVar32;
                  puVar19 = puVar44;
                  uVar25 = uVar24;
                  if ((uVar28 & 0x5000) == 0) {
                    pjVar16->curctx = pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar28 & 0xff | uVar47];
                    uVar28 = *puVar44;
                    uVar31 = -uVar28;
                    if (0 < (long)uVar28) {
                      uVar31 = uVar28;
                    }
                    jpc_mqenc_putbit(pjVar16,(uint)((uVar31 & uVar27) != 0));
                    if ((uVar31 & uVar27) != 0) goto switchD_0012c08e_caseD_0;
                    uVar28 = *puVar32;
                  }
LAB_0012ba9f:
                  *puVar35 = uVar28 & 0xffffffffffffbfff;
                  if (1 < (int)uVar25) {
                    uVar25 = uVar25 - 1;
                    puVar35 = puVar35 + lVar40;
                    puVar19 = puVar19 + lVar41;
                    uVar28 = *puVar35;
                    if ((uVar28 & 0x5000) == 0) {
                      pjVar16->curctx = pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar28 & 0xff | uVar47]
                      ;
                      uVar28 = *puVar19;
                      uVar31 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar31 = uVar28;
                      }
                      jpc_mqenc_putbit(pjVar16,(uint)((uVar31 & uVar27) != 0));
                      if ((uVar31 & uVar27) != 0) goto switchD_0012c08e_caseD_1;
                      uVar28 = *puVar35;
                    }
LAB_0012bc4e:
                    *puVar35 = uVar28 & 0xffffffffffffbfff;
                    if (1 < (int)uVar25) {
                      uVar25 = uVar25 - 1;
                      puVar35 = puVar35 + lVar40;
                      puVar19 = puVar19 + lVar41;
                      uVar28 = *puVar35;
                      if ((uVar28 & 0x5000) == 0) {
                        pjVar16->curctx =
                             pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar28 & 0xff | uVar47];
                        uVar28 = *puVar19;
                        uVar31 = -uVar28;
                        if (0 < (long)uVar28) {
                          uVar31 = uVar28;
                        }
                        jpc_mqenc_putbit(pjVar16,(uint)((uVar31 & uVar27) != 0));
                        if ((uVar31 & uVar27) != 0) goto switchD_0012c08e_caseD_2;
                        uVar28 = *puVar35;
                      }
LAB_0012bdfd:
                      *puVar35 = uVar28 & 0xffffffffffffbfff;
                      if (1 < (int)uVar25) {
                        puVar35 = puVar35 + lVar40;
                        uVar28 = *puVar35;
                        if ((uVar28 & 0x5000) == 0) {
                          pjVar16->curctx =
                               pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar28 & 0xff | uVar47];
                          uVar28 = puVar19[lVar41];
                          uVar31 = -uVar28;
                          if (0 < (long)uVar28) {
                            uVar31 = uVar28;
                          }
                          jpc_mqenc_putbit(pjVar16,(uint)((uVar27 & uVar31) != 0));
                          if ((uVar27 & uVar31) != 0) {
                            puVar19 = puVar19 + lVar41;
                            goto switchD_0012c08e_caseD_3;
                          }
                          uVar28 = *puVar35;
                        }
                        goto LAB_0012bff6;
                      }
                    }
                  }
                }
                else {
                  uVar25 = 0;
                  puVar19 = puVar44;
                  do {
                    uVar28 = *puVar19;
                    uVar31 = -uVar28;
                    if (0 < (long)uVar28) {
                      uVar31 = uVar28;
                    }
                    uVar10 = uVar25;
                    if ((uVar27 & uVar31) != 0) break;
                    uVar25 = uVar25 + 1;
                    puVar19 = puVar19 + lVar41;
                    uVar10 = uVar24;
                  } while (uVar24 != uVar25);
                  pjVar16->curctx = pjVar16->ctxs;
                  if (uVar10 < 4) {
                    jpc_mqenc_putbit(pjVar16,1);
                    pjVar16->curctx = pjVar16->ctxs + 0x12;
                    jpc_mqenc_putbit(pjVar16,uVar10 >> 1);
                    jpc_mqenc_putbit(pjVar16,uVar10 & 1);
                    puVar35 = puVar32 + (int)(uVar10 * iVar38);
                    puVar19 = puVar44 + (int)(uVar10 * (int)local_b0);
                    uVar25 = uVar24 - uVar10;
                    switch(uVar10) {
                    case 0:
switchD_0012c08e_caseD_0:
                      uVar31 = *puVar35;
                      uVar28 = *puVar19;
                      uVar29 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar29 = uVar28;
                      }
                      pjVar21->nmsedec =
                           pjVar21->nmsedec + local_f0[(uint)(uVar29 >> (bVar23 & 0x3f)) & 0x7f];
                      uVar10 = (uint)uVar31 >> 4 & 0xff;
                      pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar10];
                      uVar28 = *puVar19;
                      jpc_mqenc_putbit(pjVar16,(uint)jpc_spblut[uVar10] ^ (uint)(uVar28 >> 0x3f));
                      if ((uVar49 & 1) == 0) {
                        *(byte *)(puVar35 + (-1 - uVar20)) = (byte)puVar35[-1 - uVar20] | 2;
                        *(byte *)(puVar35 + (1 - uVar20)) = (byte)puVar35[1 - uVar20] | 4;
                        *(byte *)(puVar35 + (uVar20 - 1)) = (byte)puVar35[uVar20 - 1] | 1;
                        *(byte *)(puVar35 + uVar20 + 1) = (byte)puVar35[uVar20 + 1] | 8;
                        if ((long)uVar28 < 0) {
                          puVar35[-uVar20] = puVar35[-uVar20] | 0x440;
                          uVar28 = puVar35[uVar20] | 0x110;
                          uVar31 = 0x880;
                          uVar29 = 0x220;
                        }
                        else {
                          puVar35[-uVar20] = puVar35[-uVar20] | 0x40;
                          uVar28 = puVar35[uVar20] | 0x10;
                          uVar31 = 0x80;
                          uVar29 = 0x20;
                        }
                      }
                      else {
                        *(byte *)(puVar35 + (uVar20 - 1)) = (byte)puVar35[uVar20 - 1] | 1;
                        *(byte *)(puVar35 + uVar20 + 1) = (byte)puVar35[uVar20 + 1] | 8;
                        if ((long)uVar28 < 0) {
                          uVar28 = puVar35[uVar20] | 0x110;
                          uVar31 = 0x880;
                          uVar29 = 0x220;
                        }
                        else {
                          uVar28 = puVar35[uVar20] | 0x10;
                          uVar31 = 0x80;
                          uVar29 = 0x20;
                        }
                      }
                      puVar35[uVar20] = uVar28;
                      puVar35[-1] = puVar35[-1] | uVar29;
                      puVar35[1] = puVar35[1] | uVar31;
                      uVar28 = *puVar35 | 0x1000;
                      *puVar35 = uVar28;
                      goto LAB_0012ba9f;
                    case 1:
switchD_0012c08e_caseD_1:
                      uVar31 = *puVar35;
                      uVar28 = *puVar19;
                      uVar29 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar29 = uVar28;
                      }
                      pjVar21->nmsedec =
                           pjVar21->nmsedec + local_f0[(uint)(uVar29 >> (bVar23 & 0x3f)) & 0x7f];
                      uVar9 = (uint)uVar31 >> 4 & 0xff;
                      pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar9];
                      uVar10 = (uint)(*puVar19 >> 0x20);
                      uVar46 = uVar10 >> 0x1f;
                      jpc_mqenc_putbit(pjVar16,jpc_spblut[uVar9] ^ uVar46);
                      *(byte *)(puVar35 + (-1 - uVar20)) = (byte)puVar35[-1 - uVar20] | 2;
                      *(byte *)(puVar35 + (1 - uVar20)) = (byte)puVar35[1 - uVar20] | 4;
                      *(byte *)(puVar35 + (uVar20 - 1)) = (byte)puVar35[uVar20 - 1] | 1;
                      *(byte *)(puVar35 + uVar20 + 1) = (byte)puVar35[uVar20 + 1] | 8;
                      uVar10 = uVar10 >> 0x1f;
                      puVar35[-uVar20] = (ulong)(uVar46 << 10) | puVar35[-uVar20] | 0x40;
                      puVar35[uVar20] = (ulong)(uVar10 << 8) | puVar35[uVar20] | 0x10;
                      puVar35[-1] = (ulong)(uVar10 << 9) | puVar35[-1] | 0x20;
                      puVar35[1] = (ulong)(uVar46 << 0xb) | puVar35[1] | 0x80;
                      uVar28 = *puVar35 | 0x1000;
                      *puVar35 = uVar28;
                      goto LAB_0012bc4e;
                    case 2:
switchD_0012c08e_caseD_2:
                      uVar31 = *puVar35;
                      uVar28 = *puVar19;
                      uVar29 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar29 = uVar28;
                      }
                      pjVar21->nmsedec =
                           pjVar21->nmsedec + local_f0[(uint)(uVar29 >> (bVar23 & 0x3f)) & 0x7f];
                      uVar9 = (uint)uVar31 >> 4 & 0xff;
                      pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar9];
                      uVar10 = (uint)(*puVar19 >> 0x20);
                      uVar46 = uVar10 >> 0x1f;
                      jpc_mqenc_putbit(pjVar16,jpc_spblut[uVar9] ^ uVar46);
                      *(byte *)(puVar35 + (-1 - uVar20)) = (byte)puVar35[-1 - uVar20] | 2;
                      *(byte *)(puVar35 + (1 - uVar20)) = (byte)puVar35[1 - uVar20] | 4;
                      *(byte *)(puVar35 + (uVar20 - 1)) = (byte)puVar35[uVar20 - 1] | 1;
                      *(byte *)(puVar35 + uVar20 + 1) = (byte)puVar35[uVar20 + 1] | 8;
                      uVar10 = uVar10 >> 0x1f;
                      puVar35[-uVar20] = (ulong)(uVar46 << 10) | puVar35[-uVar20] | 0x40;
                      puVar35[uVar20] = (ulong)(uVar10 << 8) | puVar35[uVar20] | 0x10;
                      puVar35[-1] = (ulong)(uVar10 << 9) | puVar35[-1] | 0x20;
                      puVar35[1] = (ulong)(uVar46 << 0xb) | puVar35[1] | 0x80;
                      uVar28 = *puVar35 | 0x1000;
                      *puVar35 = uVar28;
                      goto LAB_0012bdfd;
                    }
switchD_0012c08e_caseD_3:
                    uVar31 = *puVar35;
                    uVar28 = *puVar19;
                    uVar29 = -uVar28;
                    if (0 < (long)uVar28) {
                      uVar29 = uVar28;
                    }
                    pjVar21->nmsedec =
                         pjVar21->nmsedec + local_f0[(uint)(uVar29 >> (bVar23 & 0x3f)) & 0x7f];
                    uVar10 = (uint)uVar31 >> 4 & 0xff;
                    pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar10];
                    uVar25 = (uint)(*puVar19 >> 0x20);
                    uVar9 = uVar25 >> 0x1f;
                    jpc_mqenc_putbit(pjVar16,jpc_spblut[uVar10] ^ uVar9);
                    *(byte *)(puVar35 + (-1 - uVar20)) = (byte)puVar35[-1 - uVar20] | 2;
                    *(byte *)(puVar35 + (1 - uVar20)) = (byte)puVar35[1 - uVar20] | 4;
                    *(byte *)(puVar35 + (uVar20 - 1)) = (byte)puVar35[uVar20 - 1] | 1;
                    *(byte *)(puVar35 + uVar20 + 1) = (byte)puVar35[uVar20 + 1] | 8;
                    uVar25 = uVar25 >> 0x1f;
                    puVar35[-uVar20] = (ulong)(uVar9 << 10) | puVar35[-uVar20] | 0x40;
                    puVar35[uVar20] = (ulong)(uVar25 << 8) | puVar35[uVar20] | 0x10;
                    puVar35[-1] = (ulong)(uVar25 << 9) | puVar35[-1] | 0x20;
                    puVar35[1] = (ulong)(uVar9 << 0xb) | puVar35[1] | 0x80;
                    uVar28 = *puVar35 | 0x1000;
                    *puVar35 = uVar28;
LAB_0012bff6:
                    *puVar35 = uVar28 & 0xffffffffffffbfff;
                  }
                  else {
                    jpc_mqenc_putbit(pjVar16,0);
                  }
                }
                bVar50 = 1 < iVar7;
                puVar32 = puVar32 + 1;
                puVar44 = puVar44 + 1;
                iVar7 = iVar7 + -1;
              } while (bVar50);
            }
            local_c0 = local_c0 + iVar38 * 4;
            local_b8 = local_b8 + (int)local_b0 * 4;
            uVar28 = (ulong)(uVar12 - 4);
          } while (4 < (int)uVar12);
        }
        if ((uVar48 & 0x20) != 0) {
          pjVar16->curctx = pjVar16->ctxs + 0x12;
          jpc_mqenc_putbit(pjVar16,1);
          jpc_mqenc_putbit(pjVar16,0);
          jpc_mqenc_putbit(pjVar16,1);
          jpc_mqenc_putbit(pjVar16,0);
        }
joined_r0x0012c142:
        if (iVar45 != 0) {
          jpc_mqenc_flush(pjVar16,uVar48 >> 4 & 1);
        }
        if (pjVar16->err != 0) {
          iVar43 = -1;
          goto LAB_0012e55e;
        }
      }
      else {
        if (iVar7 == 1) {
          if (pjVar21->type == 1) {
            pjVar16 = cblk->mqenc;
            pjVar18 = cblk->data;
            pjVar3 = cblk->flags;
            pjVar21->nmsedec = 0;
            if (pjVar3->numrows_ < 2) {
              iVar7 = 0;
            }
            else {
              iVar7 = (int)((long)pjVar3->rows_[1] - (long)*pjVar3->rows_ >> 3);
            }
            iVar8 = (int)pjVar18->numcols_;
            uVar28 = pjVar18->numrows_;
            if ((long)uVar28 < 2) {
              iVar38 = 0;
            }
            else {
              iVar38 = (int)((long)pjVar18->rows_[1] - (long)*pjVar18->rows_ >> 3);
            }
            uVar49 = 0x40 << (bVar23 & 0x1f);
            if (0 < (int)uVar28) {
              local_148 = jpc_refnmsedec;
              if (local_134 == 0) {
                local_148 = jpc_refnmsedec0;
              }
              local_128 = *pjVar18->rows_;
              local_158 = pjVar3->rows_[1];
              pjVar33 = local_158 + 1;
              lVar40 = (long)iVar7;
              iVar7 = iVar7 << 2;
              lVar41 = (long)iVar38;
              iVar38 = iVar38 << 2;
              local_140 = local_128 + lVar41;
              local_f8 = local_128 + lVar41 * 2;
              local_130 = local_128 + lVar41 * 3;
              pjVar37 = local_158 + lVar40 + 1;
              local_100 = local_158 + lVar40 * 2 + 1;
              local_158 = local_158 + lVar40 * 3 + 1;
              do {
                uVar47 = (uint)uVar28;
                if (0 < iVar8) {
                  lVar40 = 0;
                  iVar11 = iVar8 + 1;
                  do {
                    if ((*(uint *)((long)pjVar33 + lVar40) & 0x5000) == 0x1000) {
                      uVar24 = *(uint *)((long)local_128 + lVar40);
                      uVar12 = -uVar24;
                      if (0 < (int)uVar24) {
                        uVar12 = uVar24;
                      }
                      pjVar21->nmsedec =
                           pjVar21->nmsedec + local_148[uVar12 >> (bVar23 & 0x3f) & 0x7f];
                      pjVar16->curctx =
                           pjVar16->ctxs +
                           jpc_magctxnolut
                           [(ulong)((uint)(*(ulong *)((long)pjVar33 + lVar40) >> 2) & 0x800) |
                            *(ulong *)((long)pjVar33 + lVar40) & 0xff];
                      jpc_mqenc_putbit(pjVar16,(uint)((uVar49 & uVar12) != 0));
                      pbVar2 = (byte *)((long)pjVar33 + lVar40 + 1);
                      *pbVar2 = *pbVar2 | 0x20;
                    }
                    if (uVar47 != 1) {
                      if ((*(uint *)((long)pjVar37 + lVar40) & 0x5000) == 0x1000) {
                        uVar24 = *(uint *)((long)local_140 + lVar40);
                        uVar12 = -uVar24;
                        if (0 < (int)uVar24) {
                          uVar12 = uVar24;
                        }
                        pjVar21->nmsedec =
                             pjVar21->nmsedec + local_148[uVar12 >> (bVar23 & 0x3f) & 0x7f];
                        pjVar16->curctx =
                             pjVar16->ctxs +
                             jpc_magctxnolut
                             [(ulong)((uint)(*(ulong *)((long)pjVar37 + lVar40) >> 2) & 0x800) |
                              *(ulong *)((long)pjVar37 + lVar40) & 0xff];
                        jpc_mqenc_putbit(pjVar16,(uint)((uVar49 & uVar12) != 0));
                        pbVar2 = (byte *)((long)pjVar37 + lVar40 + 1);
                        *pbVar2 = *pbVar2 | 0x20;
                      }
                      if (2 < uVar47) {
                        if ((*(uint *)((long)local_100 + lVar40) & 0x5000) == 0x1000) {
                          uVar24 = *(uint *)((long)local_f8 + lVar40);
                          uVar12 = -uVar24;
                          if (0 < (int)uVar24) {
                            uVar12 = uVar24;
                          }
                          pjVar21->nmsedec =
                               pjVar21->nmsedec + local_148[uVar12 >> (bVar23 & 0x3f) & 0x7f];
                          pjVar16->curctx =
                               pjVar16->ctxs +
                               jpc_magctxnolut
                               [(ulong)((uint)(*(ulong *)((long)local_100 + lVar40) >> 2) & 0x800) |
                                *(ulong *)((long)local_100 + lVar40) & 0xff];
                          jpc_mqenc_putbit(pjVar16,(uint)((uVar49 & uVar12) != 0));
                          pbVar2 = (byte *)((long)local_100 + lVar40 + 1);
                          *pbVar2 = *pbVar2 | 0x20;
                        }
                        if ((uVar47 != 3) &&
                           ((*(uint *)((long)local_158 + lVar40) & 0x5000) == 0x1000)) {
                          uVar24 = *(uint *)((long)local_130 + lVar40);
                          uVar12 = -uVar24;
                          if (0 < (int)uVar24) {
                            uVar12 = uVar24;
                          }
                          pjVar21->nmsedec =
                               pjVar21->nmsedec + local_148[uVar12 >> (bVar23 & 0x3f) & 0x7f];
                          pjVar16->curctx =
                               pjVar16->ctxs +
                               jpc_magctxnolut
                               [(ulong)((uint)(*(ulong *)((long)local_158 + lVar40) >> 2) & 0x800) |
                                *(ulong *)((long)local_158 + lVar40) & 0xff];
                          jpc_mqenc_putbit(pjVar16,(uint)((uVar49 & uVar12) != 0));
                          pbVar2 = (byte *)((long)local_158 + lVar40 + 1);
                          *pbVar2 = *pbVar2 | 0x20;
                        }
                      }
                    }
                    iVar11 = iVar11 + -1;
                    lVar40 = lVar40 + 8;
                  } while (1 < iVar11);
                }
                local_128 = local_128 + iVar38;
                local_140 = local_140 + iVar38;
                local_f8 = local_f8 + iVar38;
                local_130 = local_130 + iVar38;
                pjVar33 = pjVar33 + iVar7;
                pjVar37 = pjVar37 + iVar7;
                local_100 = local_100 + iVar7;
                local_158 = local_158 + iVar7;
                uVar28 = (ulong)(uVar47 - 4);
              } while (4 < (int)uVar47);
            }
            goto joined_r0x0012c142;
          }
          pjVar18 = cblk->data;
          pjVar3 = cblk->flags;
          pjVar21->nmsedec = 0;
          if (pjVar3->numrows_ < 2) {
            iVar7 = 0;
          }
          else {
            iVar7 = (int)((long)pjVar3->rows_[1] - (long)*pjVar3->rows_ >> 3);
          }
          iVar8 = (int)pjVar18->numcols_;
          uVar28 = pjVar18->numrows_;
          if ((long)uVar28 < 2) {
            iVar38 = 0;
          }
          else {
            iVar38 = (int)((long)pjVar18->rows_[1] - (long)*pjVar18->rows_ >> 3);
          }
          if (0 < (int)uVar28) {
            pjVar42 = jpc_refnmsedec;
            if (local_134 == 0) {
              pjVar42 = jpc_refnmsedec0;
            }
            pjVar37 = *pjVar18->rows_;
            local_128 = pjVar3->rows_[1];
            pjVar33 = local_128 + 1;
            uVar20 = (ulong)(0x40 << (bVar23 & 0x1f));
            lVar40 = (long)iVar7;
            iVar7 = iVar7 << 2;
            lVar41 = (long)iVar38;
            iVar38 = iVar38 << 2;
            pjVar36 = local_128 + lVar40 + 1;
            local_160 = local_128 + lVar40 * 2 + 1;
            local_128 = local_128 + lVar40 * 3 + 1;
            local_148 = pjVar37 + lVar41;
            local_100 = pjVar37 + lVar41 * 2;
            local_110 = pjVar37 + lVar41 * 3;
            do {
              uVar48 = (uint)uVar28;
              if (0 < iVar8) {
                lVar40 = 0;
                iVar11 = iVar8 + 1;
                do {
                  if ((*(uint *)((long)pjVar33 + lVar40) & 0x5000) == 0x1000) {
                    uVar28 = *(ulong *)((long)pjVar37 + lVar40);
                    uVar27 = -uVar28;
                    if (0 < (long)uVar28) {
                      uVar27 = uVar28;
                    }
                    pjVar21->nmsedec =
                         pjVar21->nmsedec + pjVar42[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                    if ((bitstream->openmode_ & 2) == 0) {
                      __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                    ,0x301,
                                    "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                   );
                    }
                    iVar13 = bitstream->cnt_;
                    iVar43 = iVar13 + -1;
                    bitstream->cnt_ = iVar43;
                    uVar49 = (uint)((uVar27 & uVar20) != 0);
                    if (iVar13 < 1) {
                      uVar5 = bitstream->buf_;
                      pjVar15 = bitstream->stream_;
                      uVar24 = (uint)uVar5;
                      uVar47 = uVar24 & 0xff;
                      uVar12 = uVar47 == 0xff ^ 7;
                      bitstream->cnt_ = uVar12;
                      bitstream->buf_ = (ulong)(uVar49 << (sbyte)uVar12 | uVar47 << 8);
                      uVar47 = pjVar15->flags_;
                      iVar43 = -1;
                      if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                      if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                      goto LAB_0012e565;
                      *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                      iVar13 = pjVar15->cnt_;
                      pjVar15->cnt_ = iVar13 + -1;
                      if (iVar13 < 1) {
                        iVar13 = jas_stream_flushbuf(pjVar15,uVar24 & 0xff);
                        if (iVar13 == -1) goto LAB_0012e56f;
                      }
                      else {
                        pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                        puVar6 = pjVar15->ptr_;
                        pjVar15->ptr_ = puVar6 + 1;
                        *puVar6 = (uchar)uVar5;
                      }
                    }
                    else {
                      bitstream->buf_ =
                           bitstream->buf_ | (long)(int)(uVar49 << ((byte)iVar43 & 0x1f));
                    }
                    pbVar2 = (byte *)((long)pjVar33 + lVar40 + 1);
                    *pbVar2 = *pbVar2 | 0x20;
                  }
                  if (uVar48 != 1) {
                    if ((*(uint *)((long)pjVar36 + lVar40) & 0x5000) == 0x1000) {
                      uVar28 = *(ulong *)((long)local_148 + lVar40);
                      uVar27 = -uVar28;
                      if (0 < (long)uVar28) {
                        uVar27 = uVar28;
                      }
                      pjVar21->nmsedec =
                           pjVar21->nmsedec + pjVar42[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                      if ((bitstream->openmode_ & 2) == 0) {
                        __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                      ,0x308,
                                      "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                     );
                      }
                      iVar13 = bitstream->cnt_;
                      iVar43 = iVar13 + -1;
                      bitstream->cnt_ = iVar43;
                      uVar49 = (uint)((uVar27 & uVar20) != 0);
                      if (iVar13 < 1) {
                        uVar5 = bitstream->buf_;
                        pjVar15 = bitstream->stream_;
                        uVar24 = (uint)uVar5;
                        uVar47 = uVar24 & 0xff;
                        uVar12 = uVar47 == 0xff ^ 7;
                        bitstream->cnt_ = uVar12;
                        bitstream->buf_ = (ulong)(uVar49 << (sbyte)uVar12 | uVar47 << 8);
                        uVar47 = pjVar15->flags_;
                        iVar43 = -1;
                        if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                        if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                        goto LAB_0012e565;
                        *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                        iVar13 = pjVar15->cnt_;
                        pjVar15->cnt_ = iVar13 + -1;
                        if (iVar13 < 1) {
                          iVar13 = jas_stream_flushbuf(pjVar15,uVar24 & 0xff);
                          if (iVar13 == -1) goto LAB_0012e56f;
                        }
                        else {
                          pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                          puVar6 = pjVar15->ptr_;
                          pjVar15->ptr_ = puVar6 + 1;
                          *puVar6 = (uchar)uVar5;
                        }
                      }
                      else {
                        bitstream->buf_ =
                             bitstream->buf_ | (long)(int)(uVar49 << ((byte)iVar43 & 0x1f));
                      }
                      pbVar2 = (byte *)((long)pjVar36 + lVar40 + 1);
                      *pbVar2 = *pbVar2 | 0x20;
                    }
                    if (2 < uVar48) {
                      if ((*(uint *)((long)local_160 + lVar40) & 0x5000) == 0x1000) {
                        uVar28 = *(ulong *)((long)local_100 + lVar40);
                        uVar27 = -uVar28;
                        if (0 < (long)uVar28) {
                          uVar27 = uVar28;
                        }
                        pjVar21->nmsedec =
                             pjVar21->nmsedec + pjVar42[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                        if ((bitstream->openmode_ & 2) == 0) {
                          __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                        ,0x30f,
                                        "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                       );
                        }
                        iVar13 = bitstream->cnt_;
                        iVar43 = iVar13 + -1;
                        bitstream->cnt_ = iVar43;
                        uVar49 = (uint)((uVar27 & uVar20) != 0);
                        if (iVar13 < 1) {
                          uVar5 = bitstream->buf_;
                          pjVar15 = bitstream->stream_;
                          uVar24 = (uint)uVar5;
                          uVar47 = uVar24 & 0xff;
                          uVar12 = uVar47 == 0xff ^ 7;
                          bitstream->cnt_ = uVar12;
                          bitstream->buf_ = (ulong)(uVar49 << (sbyte)uVar12 | uVar47 << 8);
                          uVar47 = pjVar15->flags_;
                          iVar43 = -1;
                          if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                          if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                          goto LAB_0012e565;
                          *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                          iVar13 = pjVar15->cnt_;
                          pjVar15->cnt_ = iVar13 + -1;
                          if (iVar13 < 1) {
                            iVar13 = jas_stream_flushbuf(pjVar15,uVar24 & 0xff);
                            if (iVar13 == -1) goto LAB_0012e56f;
                          }
                          else {
                            pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                            puVar6 = pjVar15->ptr_;
                            pjVar15->ptr_ = puVar6 + 1;
                            *puVar6 = (uchar)uVar5;
                          }
                        }
                        else {
                          bitstream->buf_ =
                               bitstream->buf_ | (long)(int)(uVar49 << ((byte)iVar43 & 0x1f));
                        }
                        pbVar2 = (byte *)((long)local_160 + lVar40 + 1);
                        *pbVar2 = *pbVar2 | 0x20;
                      }
                      if ((uVar48 != 3) &&
                         ((*(uint *)((long)local_128 + lVar40) & 0x5000) == 0x1000)) {
                        uVar28 = *(ulong *)((long)local_110 + lVar40);
                        uVar27 = -uVar28;
                        if (0 < (long)uVar28) {
                          uVar27 = uVar28;
                        }
                        pjVar21->nmsedec =
                             pjVar21->nmsedec + pjVar42[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                        if ((bitstream->openmode_ & 2) == 0) {
                          __assert_fail("((out))->openmode_ & JPC_BITSTREAM_WRITE",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                        ,0x316,
                                        "int jpc_encrawrefpass(jpc_bitstream_t *, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                       );
                        }
                        iVar13 = bitstream->cnt_;
                        iVar43 = iVar13 + -1;
                        bitstream->cnt_ = iVar43;
                        uVar49 = (uint)((uVar27 & uVar20) != 0);
                        if (iVar13 < 1) {
                          uVar5 = bitstream->buf_;
                          pjVar15 = bitstream->stream_;
                          uVar24 = (uint)uVar5;
                          uVar47 = uVar24 & 0xff;
                          uVar12 = uVar47 == 0xff ^ 7;
                          bitstream->cnt_ = uVar12;
                          bitstream->buf_ = (ulong)(uVar49 << (sbyte)uVar12 | uVar47 << 8);
                          uVar47 = pjVar15->flags_;
                          iVar43 = -1;
                          if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                          if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                          goto LAB_0012e565;
                          *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                          iVar13 = pjVar15->cnt_;
                          pjVar15->cnt_ = iVar13 + -1;
                          if (iVar13 < 1) {
                            iVar13 = jas_stream_flushbuf(pjVar15,uVar24 & 0xff);
                            if (iVar13 == -1) goto LAB_0012e56f;
                          }
                          else {
                            pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                            puVar6 = pjVar15->ptr_;
                            pjVar15->ptr_ = puVar6 + 1;
                            *puVar6 = (uchar)uVar5;
                          }
                        }
                        else {
                          bitstream->buf_ =
                               bitstream->buf_ | (long)(int)(uVar49 << ((byte)iVar43 & 0x1f));
                        }
                        pbVar2 = (byte *)((long)local_128 + lVar40 + 1);
                        *pbVar2 = *pbVar2 | 0x20;
                      }
                    }
                  }
                  iVar11 = iVar11 + -1;
                  lVar40 = lVar40 + 8;
                } while (1 < iVar11);
              }
              pjVar33 = pjVar33 + iVar7;
              pjVar36 = pjVar36 + iVar7;
              local_160 = local_160 + iVar7;
              local_128 = local_128 + iVar7;
              pjVar37 = pjVar37 + iVar38;
              local_148 = local_148 + iVar38;
              local_100 = local_100 + iVar38;
              local_110 = local_110 + iVar38;
              uVar28 = (ulong)(uVar48 - 4);
            } while (4 < (int)uVar48);
          }
        }
        else {
          if (iVar7 != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                          ,0x127,
                          "int jpc_enc_enccblk(jpc_enc_tcmpt_t *, jpc_enc_band_t *, jpc_enc_cblk_t *)"
                         );
          }
          if (pjVar21->type == 1) {
            pjVar16 = cblk->mqenc;
            pjVar18 = cblk->data;
            iVar7 = band->orient;
            pjVar3 = cblk->flags;
            pjVar21->nmsedec = 0;
            if (pjVar3->numrows_ < 2) {
              uVar28 = 0;
            }
            else {
              uVar28 = (long)pjVar3->rows_[1] - (long)*pjVar3->rows_ >> 3;
            }
            iVar8 = (int)pjVar18->numcols_;
            local_148 = (jpc_fix_t *)pjVar18->numrows_;
            if ((long)local_148 < 2) {
              iVar38 = 0;
            }
            else {
              iVar38 = (int)((long)pjVar18->rows_[1] - (long)*pjVar18->rows_ >> 3);
            }
            if (0 < (int)(uint)local_148) {
              local_110 = jpc_signmsedec;
              if (local_134 == 0) {
                local_110 = jpc_signmsedec0;
              }
              local_50 = pjVar3->rows_[1];
              uVar20 = uVar28 & 0xffffffff;
              lVar40 = (long)(int)uVar28;
              pjVar33 = local_50 + 2;
              local_b8 = (ulong *)(pjVar33 + -uVar20);
              local_158 = local_50 + lVar40 + 2;
              local_120 = local_50 + lVar40 * 2 + 2;
              local_d8 = local_50 + lVar40 * 3 + 2;
              local_f0 = local_50 + uVar20 + 2;
              local_c0 = (ulong *)(local_50 + lVar40 + uVar20 + 2);
              local_a0 = local_50 + ((lVar40 + 2) - uVar20);
              local_88 = local_50 + uVar20 + lVar40 * 2 + 2;
              local_a8 = local_50 + ((lVar40 * 2 + 2) - uVar20);
              local_b0 = local_50 + uVar20 + lVar40 * 3 + 2;
              local_50 = local_50 + ((lVar40 * 3 + 2) - uVar20);
              pjVar26 = *pjVar18->rows_;
              iVar11 = (int)uVar28 * 4;
              uVar28 = (ulong)(0x40 << (bVar23 & 0x1f));
              uVar47 = iVar7 << 8;
              lVar40 = (long)iVar38;
              iVar38 = iVar38 << 2;
              pjVar37 = pjVar26 + lVar40;
              pjVar30 = pjVar26 + lVar40 * 2;
              pjVar36 = pjVar26 + lVar40 * 3;
              do {
                if (0 < iVar8) {
                  lVar40 = 0;
                  iVar7 = iVar8 + 1;
                  do {
                    uVar20 = *(ulong *)((long)pjVar33 + lVar40 + -8);
                    if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                      uVar27 = *(ulong *)((long)pjVar26 + lVar40);
                      uVar31 = -uVar27;
                      if (0 < (long)uVar27) {
                        uVar31 = uVar27;
                      }
                      pjVar16->curctx = pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar47]
                      ;
                      jpc_mqenc_putbit(pjVar16,(uint)((uVar31 & uVar28) != 0));
                      if ((uVar31 & uVar28) == 0) {
                        uVar20 = *(ulong *)((long)pjVar33 + lVar40 + -8);
                      }
                      else {
                        uVar27 = *(ulong *)((long)pjVar26 + lVar40);
                        uVar31 = -uVar27;
                        if (0 < (long)uVar27) {
                          uVar31 = uVar27;
                        }
                        pjVar21->nmsedec =
                             pjVar21->nmsedec + local_110[(uint)(uVar31 >> (bVar23 & 0x3f)) & 0x7f];
                        lVar41 = *(long *)((long)pjVar26 + lVar40);
                        uVar24 = (uint)uVar20 >> 4 & 0xff;
                        pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar24];
                        jpc_mqenc_putbit(pjVar16,(uint)jpc_spblut[uVar24] ^
                                                 (uint)((ulong)lVar41 >> 0x3f));
                        if ((uVar49 & 1) == 0) {
                          pbVar2 = (byte *)((long)local_b8 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 2;
                          *(byte *)((long)local_b8 + lVar40) =
                               *(byte *)((long)local_b8 + lVar40) | 4;
                          pbVar2 = (byte *)((long)local_f0 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 1;
                          *(byte *)((long)local_f0 + lVar40) =
                               *(byte *)((long)local_f0 + lVar40) | 8;
                          uVar20 = *(ulong *)((long)local_b8 + lVar40 + -8);
                          if (-1 < lVar41) {
                            *(ulong *)((long)local_b8 + lVar40 + -8) = uVar20 | 0x40;
                            uVar20 = *(ulong *)((long)local_f0 + lVar40 + -8);
                            goto LAB_0012ce9a;
                          }
                          *(ulong *)((long)local_b8 + lVar40 + -8) = uVar20 | 0x440;
                          uVar20 = *(ulong *)((long)local_f0 + lVar40 + -8);
LAB_0012ceca:
                          uVar20 = uVar20 | 0x110;
                          uVar27 = 0x880;
                          uVar31 = 0x220;
                        }
                        else {
                          pbVar2 = (byte *)((long)local_f0 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 1;
                          *(byte *)((long)local_f0 + lVar40) =
                               *(byte *)((long)local_f0 + lVar40) | 8;
                          uVar20 = *(ulong *)((long)local_f0 + lVar40 + -8);
                          if (lVar41 < 0) goto LAB_0012ceca;
LAB_0012ce9a:
                          uVar20 = uVar20 | 0x10;
                          uVar27 = 0x80;
                          uVar31 = 0x20;
                        }
                        *(ulong *)((long)local_f0 + lVar40 + -8) = uVar20;
                        puVar32 = (ulong *)((long)pjVar33 + lVar40 + -0x10);
                        *puVar32 = *puVar32 | uVar31;
                        *(ulong *)((long)pjVar33 + lVar40) =
                             *(ulong *)((long)pjVar33 + lVar40) | uVar27;
                        uVar20 = *(ulong *)((long)pjVar33 + lVar40 + -8) | 0x1000;
                      }
                      *(ulong *)((long)pjVar33 + lVar40 + -8) = uVar20 | 0x4000;
                    }
                    if ((uint)local_148 != 1) {
                      uVar20 = *(ulong *)((long)local_158 + lVar40 + -8);
                      if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                        uVar27 = *(ulong *)((long)pjVar37 + lVar40);
                        uVar31 = -uVar27;
                        if (0 < (long)uVar27) {
                          uVar31 = uVar27;
                        }
                        pjVar16->curctx =
                             pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar47];
                        jpc_mqenc_putbit(pjVar16,(uint)((uVar31 & uVar28) != 0));
                        if ((uVar31 & uVar28) == 0) {
                          uVar20 = *(ulong *)((long)local_158 + lVar40 + -8);
                        }
                        else {
                          uVar27 = *(ulong *)((long)pjVar37 + lVar40);
                          uVar31 = -uVar27;
                          if (0 < (long)uVar27) {
                            uVar31 = uVar27;
                          }
                          pjVar21->nmsedec =
                               pjVar21->nmsedec +
                               local_110[(uint)(uVar31 >> (bVar23 & 0x3f)) & 0x7f];
                          uVar4 = *(undefined8 *)((long)pjVar37 + lVar40);
                          uVar12 = (uint)uVar20 >> 4 & 0xff;
                          pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar12];
                          uVar24 = (uint)((ulong)uVar4 >> 0x20);
                          uVar25 = uVar24 >> 0x1f;
                          jpc_mqenc_putbit(pjVar16,jpc_spblut[uVar12] ^ uVar25);
                          pbVar2 = (byte *)((long)local_a0 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 2;
                          *(byte *)((long)local_a0 + lVar40) =
                               *(byte *)((long)local_a0 + lVar40) | 4;
                          pbVar2 = (byte *)((long)local_c0 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 1;
                          *(byte *)((long)local_c0 + lVar40) =
                               *(byte *)((long)local_c0 + lVar40) | 8;
                          uVar24 = uVar24 >> 0x1f;
                          *(ulong *)((long)local_a0 + lVar40 + -8) =
                               (ulong)(uVar25 << 10) | *(ulong *)((long)local_a0 + lVar40 + -8) |
                               0x40;
                          *(ulong *)((long)local_c0 + lVar40 + -8) =
                               (ulong)(uVar24 << 8) | *(ulong *)((long)local_c0 + lVar40 + -8) |
                               0x10;
                          *(ulong *)((long)local_158 + lVar40 + -0x10) =
                               (ulong)(uVar24 << 9) | *(ulong *)((long)local_158 + lVar40 + -0x10) |
                               0x20;
                          *(ulong *)((long)local_158 + lVar40) =
                               (ulong)(uVar25 << 0xb) | *(ulong *)((long)local_158 + lVar40) | 0x80;
                          uVar20 = *(ulong *)((long)local_158 + lVar40 + -8) | 0x1000;
                        }
                        *(ulong *)((long)local_158 + lVar40 + -8) = uVar20 | 0x4000;
                      }
                      if (2 < (uint)local_148) {
                        uVar20 = *(ulong *)((long)local_120 + lVar40 + -8);
                        if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                          uVar27 = *(ulong *)((long)pjVar30 + lVar40);
                          uVar31 = -uVar27;
                          if (0 < (long)uVar27) {
                            uVar31 = uVar27;
                          }
                          pjVar16->curctx =
                               pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar47];
                          jpc_mqenc_putbit(pjVar16,(uint)((uVar31 & uVar28) != 0));
                          if ((uVar31 & uVar28) == 0) {
                            uVar20 = *(ulong *)((long)local_120 + lVar40 + -8);
                          }
                          else {
                            uVar27 = *(ulong *)((long)pjVar30 + lVar40);
                            uVar31 = -uVar27;
                            if (0 < (long)uVar27) {
                              uVar31 = uVar27;
                            }
                            pjVar21->nmsedec =
                                 pjVar21->nmsedec +
                                 local_110[(uint)(uVar31 >> (bVar23 & 0x3f)) & 0x7f];
                            uVar4 = *(undefined8 *)((long)pjVar30 + lVar40);
                            uVar12 = (uint)uVar20 >> 4 & 0xff;
                            pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar12];
                            uVar24 = (uint)((ulong)uVar4 >> 0x20);
                            uVar25 = uVar24 >> 0x1f;
                            jpc_mqenc_putbit(pjVar16,jpc_spblut[uVar12] ^ uVar25);
                            pbVar2 = (byte *)((long)local_a8 + lVar40 + -0x10);
                            *pbVar2 = *pbVar2 | 2;
                            *(byte *)((long)local_a8 + lVar40) =
                                 *(byte *)((long)local_a8 + lVar40) | 4;
                            pbVar2 = (byte *)((long)local_88 + lVar40 + -0x10);
                            *pbVar2 = *pbVar2 | 1;
                            *(byte *)((long)local_88 + lVar40) =
                                 *(byte *)((long)local_88 + lVar40) | 8;
                            uVar24 = uVar24 >> 0x1f;
                            *(ulong *)((long)local_a8 + lVar40 + -8) =
                                 (ulong)(uVar25 << 10) | *(ulong *)((long)local_a8 + lVar40 + -8) |
                                 0x40;
                            *(ulong *)((long)local_88 + lVar40 + -8) =
                                 (ulong)(uVar24 << 8) | *(ulong *)((long)local_88 + lVar40 + -8) |
                                 0x10;
                            *(ulong *)((long)local_120 + lVar40 + -0x10) =
                                 (ulong)(uVar24 << 9) | *(ulong *)((long)local_120 + lVar40 + -0x10)
                                 | 0x20;
                            *(ulong *)((long)local_120 + lVar40) =
                                 (ulong)(uVar25 << 0xb) | *(ulong *)((long)local_120 + lVar40) |
                                 0x80;
                            uVar20 = *(ulong *)((long)local_120 + lVar40 + -8) | 0x1000;
                          }
                          *(ulong *)((long)local_120 + lVar40 + -8) = uVar20 | 0x4000;
                        }
                        if ((uint)local_148 != 3) {
                          uVar20 = *(ulong *)((long)local_d8 + lVar40 + -8);
                          if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                            uVar27 = *(ulong *)((long)pjVar36 + lVar40);
                            uVar31 = -uVar27;
                            if (0 < (long)uVar27) {
                              uVar31 = uVar27;
                            }
                            pjVar16->curctx =
                                 pjVar16->ctxs + jpc_zcctxnolut[(uint)uVar20 & 0xff | uVar47];
                            jpc_mqenc_putbit(pjVar16,(uint)((uVar31 & uVar28) != 0));
                            if ((uVar31 & uVar28) == 0) {
                              uVar20 = *(ulong *)((long)local_d8 + lVar40 + -8);
                            }
                            else {
                              uVar27 = *(ulong *)((long)pjVar36 + lVar40);
                              uVar31 = -uVar27;
                              if (0 < (long)uVar27) {
                                uVar31 = uVar27;
                              }
                              pjVar21->nmsedec =
                                   pjVar21->nmsedec +
                                   local_110[(uint)(uVar31 >> (bVar23 & 0x3f)) & 0x7f];
                              uVar4 = *(undefined8 *)((long)pjVar36 + lVar40);
                              uVar12 = (uint)uVar20 >> 4 & 0xff;
                              pjVar16->curctx = pjVar16->ctxs + jpc_scctxnolut[uVar12];
                              uVar24 = (uint)((ulong)uVar4 >> 0x20);
                              uVar25 = uVar24 >> 0x1f;
                              jpc_mqenc_putbit(pjVar16,jpc_spblut[uVar12] ^ uVar25);
                              pbVar2 = (byte *)((long)local_50 + lVar40 + -0x10);
                              *pbVar2 = *pbVar2 | 2;
                              *(byte *)((long)local_50 + lVar40) =
                                   *(byte *)((long)local_50 + lVar40) | 4;
                              pbVar2 = (byte *)((long)local_b0 + lVar40 + -0x10);
                              *pbVar2 = *pbVar2 | 1;
                              *(byte *)((long)local_b0 + lVar40) =
                                   *(byte *)((long)local_b0 + lVar40) | 8;
                              uVar24 = uVar24 >> 0x1f;
                              *(ulong *)((long)local_50 + lVar40 + -8) =
                                   (ulong)(uVar25 << 10) | *(ulong *)((long)local_50 + lVar40 + -8)
                                   | 0x40;
                              *(ulong *)((long)local_b0 + lVar40 + -8) =
                                   (ulong)(uVar24 << 8) | *(ulong *)((long)local_b0 + lVar40 + -8) |
                                   0x10;
                              *(ulong *)((long)local_d8 + lVar40 + -0x10) =
                                   (ulong)(uVar24 << 9) |
                                   *(ulong *)((long)local_d8 + lVar40 + -0x10) | 0x20;
                              *(ulong *)((long)local_d8 + lVar40) =
                                   (ulong)(uVar25 << 0xb) | *(ulong *)((long)local_d8 + lVar40) |
                                   0x80;
                              uVar20 = *(ulong *)((long)local_d8 + lVar40 + -8) | 0x1000;
                            }
                            *(ulong *)((long)local_d8 + lVar40 + -8) = uVar20 | 0x4000;
                          }
                        }
                      }
                    }
                    iVar7 = iVar7 + -1;
                    lVar40 = lVar40 + 8;
                  } while (1 < iVar7);
                }
                pjVar26 = pjVar26 + iVar38;
                pjVar37 = pjVar37 + iVar38;
                pjVar30 = pjVar30 + iVar38;
                pjVar36 = pjVar36 + iVar38;
                pjVar33 = pjVar33 + iVar11;
                local_f0 = local_f0 + iVar11;
                local_b8 = local_b8 + iVar11;
                local_158 = local_158 + iVar11;
                local_c0 = local_c0 + iVar11;
                local_a0 = local_a0 + iVar11;
                local_120 = local_120 + iVar11;
                local_88 = local_88 + iVar11;
                local_a8 = local_a8 + iVar11;
                local_d8 = local_d8 + iVar11;
                local_b0 = local_b0 + iVar11;
                local_50 = local_50 + iVar11;
                bVar50 = 4 < (int)(uint)local_148;
                local_148 = (jpc_fix_t *)(ulong)((uint)local_148 - 4);
              } while (bVar50);
            }
            goto joined_r0x0012c142;
          }
          pjVar18 = cblk->data;
          pjVar3 = cblk->flags;
          pjVar21->nmsedec = 0;
          if (pjVar3->numrows_ < 2) {
            uVar28 = 0;
          }
          else {
            uVar28 = (long)pjVar3->rows_[1] - (long)*pjVar3->rows_ >> 3;
          }
          iVar7 = (int)pjVar18->numcols_;
          uVar20 = pjVar18->numrows_;
          if ((long)uVar20 < 2) {
            iVar8 = 0;
          }
          else {
            iVar8 = (int)((long)pjVar18->rows_[1] - (long)*pjVar18->rows_ >> 3);
          }
          if (0 < (int)uVar20) {
            local_150 = jpc_signmsedec;
            if (local_134 == 0) {
              local_150 = jpc_signmsedec0;
            }
            local_98 = pjVar3->rows_[1];
            uVar27 = uVar28 & 0xffffffff;
            lVar40 = (long)(int)uVar28;
            pjVar33 = local_98 + 2;
            pjVar26 = pjVar33 + -uVar27;
            pjVar36 = local_98 + lVar40 + 2;
            local_140 = local_98 + lVar40 * 2 + 2;
            local_110 = local_98 + lVar40 * 3 + 2;
            local_128 = local_98 + uVar27 + 2;
            local_f0 = local_98 + lVar40 + uVar27 + 2;
            local_e8 = local_98 + ((lVar40 + 2) - uVar27);
            local_d8 = local_98 + uVar27 + lVar40 * 2 + 2;
            local_b8 = (ulong *)(local_98 + ((lVar40 * 2 + 2) - uVar27));
            local_a0 = local_98 + uVar27 + lVar40 * 3 + 2;
            local_98 = local_98 + ((lVar40 * 3 + 2) - uVar27);
            pjVar37 = *pjVar18->rows_;
            iVar38 = (int)uVar28 * 4;
            uVar28 = (ulong)(0x40 << (bVar23 & 0x1f));
            lVar40 = (long)iVar8;
            iVar8 = iVar8 << 2;
            local_100 = pjVar37 + lVar40;
            local_f8 = pjVar37 + lVar40 * 2;
            local_d0 = pjVar37 + lVar40 * 3;
            do {
              uVar48 = (uint)uVar20;
              if (0 < iVar7) {
                lVar40 = 0;
                iVar11 = iVar7 + 1;
                do {
                  uVar20 = *(ulong *)((long)pjVar33 + lVar40 + -8);
                  if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                    uVar20 = *(ulong *)((long)pjVar37 + lVar40);
                    uVar27 = -uVar20;
                    if (0 < (long)uVar20) {
                      uVar27 = uVar20;
                    }
                    if ((bitstream->openmode_ & 2) == 0) {
                      pcVar39 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012e64b:
                      __assert_fail(pcVar39,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                    ,0x23e,
                                    "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                   );
                    }
                    iVar13 = bitstream->cnt_;
                    iVar43 = iVar13 + -1;
                    bitstream->cnt_ = iVar43;
                    uVar47 = (uint)((uVar27 & uVar28) != 0);
                    if (iVar13 < 1) {
                      uVar5 = bitstream->buf_;
                      pjVar15 = bitstream->stream_;
                      uVar12 = (uint)uVar5;
                      uVar24 = uVar12 & 0xff;
                      uVar25 = uVar24 == 0xff ^ 7;
                      bitstream->cnt_ = uVar25;
                      bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar25 | uVar24 << 8);
                      uVar47 = pjVar15->flags_;
                      iVar43 = -1;
                      if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                      if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                      goto LAB_0012e565;
                      *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                      iVar13 = pjVar15->cnt_;
                      pjVar15->cnt_ = iVar13 + -1;
                      if (iVar13 < 1) {
                        iVar13 = jas_stream_flushbuf(pjVar15,uVar12 & 0xff);
                        if (iVar13 == -1) goto LAB_0012e56f;
                      }
                      else {
                        pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                        puVar6 = pjVar15->ptr_;
                        pjVar15->ptr_ = puVar6 + 1;
                        *puVar6 = (uchar)uVar5;
                      }
                    }
                    else {
                      bitstream->buf_ =
                           bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar43 & 0x1f));
                    }
                    if ((uVar27 & uVar28) == 0) {
                      uVar20 = *(ulong *)((long)pjVar33 + lVar40 + -8);
                    }
                    else {
                      uVar20 = *(ulong *)((long)pjVar37 + lVar40);
                      uVar27 = -uVar20;
                      if (0 < (long)uVar20) {
                        uVar27 = uVar20;
                      }
                      pjVar21->nmsedec =
                           pjVar21->nmsedec + local_150[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                      if ((bitstream->openmode_ & 2) == 0) {
                        pcVar39 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                        goto LAB_0012e64b;
                      }
                      lVar41 = *(long *)((long)pjVar37 + lVar40);
                      iVar13 = bitstream->cnt_;
                      iVar43 = iVar13 + -1;
                      bitstream->cnt_ = iVar43;
                      uVar47 = (uint)((ulong)lVar41 >> 0x3f);
                      if (iVar13 < 1) {
                        uVar5 = bitstream->buf_;
                        pjVar15 = bitstream->stream_;
                        uVar24 = (uint)uVar5 & 0xff;
                        uVar12 = uVar24 == 0xff ^ 7;
                        bitstream->cnt_ = uVar12;
                        uVar24 = uVar47 << (sbyte)uVar12 | uVar24 << 8;
                        bitstream->buf_ = (ulong)uVar24;
                        uVar47 = pjVar15->flags_;
                        iVar43 = -1;
                        if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                        if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                        goto LAB_0012e565;
                        *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                        iVar13 = pjVar15->cnt_;
                        pjVar15->cnt_ = iVar13 + -1;
                        if (iVar13 < 1) {
                          iVar13 = jas_stream_flushbuf(pjVar15,uVar24 >> 8);
                          if (iVar13 == -1) goto LAB_0012e56f;
                        }
                        else {
                          pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                          puVar6 = pjVar15->ptr_;
                          pjVar15->ptr_ = puVar6 + 1;
                          *puVar6 = (uchar)uVar5;
                        }
                      }
                      else {
                        bitstream->buf_ =
                             bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar43 & 0x1f));
                      }
                      if ((uVar49 & 1) == 0) {
                        pbVar2 = (byte *)((long)pjVar26 + lVar40 + -0x10);
                        *pbVar2 = *pbVar2 | 2;
                        *(byte *)((long)pjVar26 + lVar40) = *(byte *)((long)pjVar26 + lVar40) | 4;
                        pbVar2 = (byte *)((long)local_128 + lVar40 + -0x10);
                        *pbVar2 = *pbVar2 | 1;
                        *(byte *)((long)local_128 + lVar40) =
                             *(byte *)((long)local_128 + lVar40) | 8;
                        uVar20 = *(ulong *)((long)pjVar26 + lVar40 + -8);
                        if (lVar41 < 0) {
                          *(ulong *)((long)pjVar26 + lVar40 + -8) = uVar20 | 0x440;
                          uVar20 = *(ulong *)((long)local_128 + lVar40 + -8) | 0x110;
                          uVar27 = 0x880;
                          uVar31 = 0x220;
                        }
                        else {
                          *(ulong *)((long)pjVar26 + lVar40 + -8) = uVar20 | 0x40;
                          uVar20 = *(ulong *)((long)local_128 + lVar40 + -8) | 0x10;
                          uVar27 = 0x80;
                          uVar31 = 0x20;
                        }
                      }
                      else {
                        pbVar2 = (byte *)((long)local_128 + lVar40 + -0x10);
                        *pbVar2 = *pbVar2 | 1;
                        *(byte *)((long)local_128 + lVar40) =
                             *(byte *)((long)local_128 + lVar40) | 8;
                        uVar20 = *(ulong *)((long)local_128 + lVar40 + -8);
                        if (lVar41 < 0) {
                          uVar20 = uVar20 | 0x110;
                          uVar27 = 0x880;
                          uVar31 = 0x220;
                        }
                        else {
                          uVar20 = uVar20 | 0x10;
                          uVar27 = 0x80;
                          uVar31 = 0x20;
                        }
                      }
                      *(ulong *)((long)local_128 + lVar40 + -8) = uVar20;
                      puVar32 = (ulong *)((long)pjVar33 + lVar40 + -0x10);
                      *puVar32 = *puVar32 | uVar31;
                      *(ulong *)((long)pjVar33 + lVar40) =
                           *(ulong *)((long)pjVar33 + lVar40) | uVar27;
                      uVar20 = *(ulong *)((long)pjVar33 + lVar40 + -8) | 0x1000;
                    }
                    *(ulong *)((long)pjVar33 + lVar40 + -8) = uVar20 | 0x4000;
                  }
                  if (uVar48 != 1) {
                    uVar20 = *(ulong *)((long)pjVar36 + lVar40 + -8);
                    if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                      uVar20 = *(ulong *)((long)local_100 + lVar40);
                      uVar27 = -uVar20;
                      if (0 < (long)uVar20) {
                        uVar27 = uVar20;
                      }
                      if ((bitstream->openmode_ & 2) == 0) {
                        pcVar39 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012e6b6:
                        __assert_fail(pcVar39,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                      ,0x246,
                                      "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                     );
                      }
                      iVar13 = bitstream->cnt_;
                      iVar43 = iVar13 + -1;
                      bitstream->cnt_ = iVar43;
                      uVar47 = (uint)((uVar27 & uVar28) != 0);
                      if (iVar13 < 1) {
                        uVar5 = bitstream->buf_;
                        pjVar15 = bitstream->stream_;
                        uVar12 = (uint)uVar5;
                        uVar24 = uVar12 & 0xff;
                        uVar25 = uVar24 == 0xff ^ 7;
                        bitstream->cnt_ = uVar25;
                        bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar25 | uVar24 << 8);
                        uVar47 = pjVar15->flags_;
                        iVar43 = -1;
                        if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                        if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                        goto LAB_0012e565;
                        *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                        iVar13 = pjVar15->cnt_;
                        pjVar15->cnt_ = iVar13 + -1;
                        if (iVar13 < 1) {
                          iVar13 = jas_stream_flushbuf(pjVar15,uVar12 & 0xff);
                          if (iVar13 == -1) goto LAB_0012e56f;
                        }
                        else {
                          pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                          puVar6 = pjVar15->ptr_;
                          pjVar15->ptr_ = puVar6 + 1;
                          *puVar6 = (uchar)uVar5;
                        }
                      }
                      else {
                        bitstream->buf_ =
                             bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar43 & 0x1f));
                      }
                      if ((uVar27 & uVar28) == 0) {
                        uVar20 = *(ulong *)((long)pjVar36 + lVar40 + -8);
                      }
                      else {
                        uVar20 = *(ulong *)((long)local_100 + lVar40);
                        uVar27 = -uVar20;
                        if (0 < (long)uVar20) {
                          uVar27 = uVar20;
                        }
                        pjVar21->nmsedec =
                             pjVar21->nmsedec + local_150[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                        if ((bitstream->openmode_ & 2) == 0) {
                          pcVar39 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                          goto LAB_0012e6b6;
                        }
                        uVar4 = *(undefined8 *)((long)local_100 + lVar40);
                        iVar13 = bitstream->cnt_;
                        iVar43 = iVar13 + -1;
                        bitstream->cnt_ = iVar43;
                        uVar24 = (uint)((ulong)uVar4 >> 0x20);
                        uVar12 = uVar24 >> 0x1f;
                        if (iVar13 < 1) {
                          uVar5 = bitstream->buf_;
                          pjVar15 = bitstream->stream_;
                          uVar47 = (uint)uVar5 & 0xff;
                          uVar25 = uVar47 == 0xff ^ 7;
                          bitstream->cnt_ = uVar25;
                          uVar25 = uVar12 << (sbyte)uVar25 | uVar47 << 8;
                          bitstream->buf_ = (ulong)uVar25;
                          uVar47 = pjVar15->flags_;
                          iVar43 = -1;
                          if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                          if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                          goto LAB_0012e565;
                          *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                          iVar13 = pjVar15->cnt_;
                          pjVar15->cnt_ = iVar13 + -1;
                          if (iVar13 < 1) {
                            iVar13 = jas_stream_flushbuf(pjVar15,uVar25 >> 8);
                            if (iVar13 == -1) goto LAB_0012e56f;
                          }
                          else {
                            pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                            puVar6 = pjVar15->ptr_;
                            pjVar15->ptr_ = puVar6 + 1;
                            *puVar6 = (uchar)uVar5;
                          }
                        }
                        else {
                          bitstream->buf_ =
                               bitstream->buf_ | (long)(int)(uVar12 << ((byte)iVar43 & 0x1f));
                        }
                        pbVar2 = (byte *)((long)local_e8 + lVar40 + -0x10);
                        *pbVar2 = *pbVar2 | 2;
                        *(byte *)((long)local_e8 + lVar40) = *(byte *)((long)local_e8 + lVar40) | 4;
                        pbVar2 = (byte *)((long)local_f0 + lVar40 + -0x10);
                        *pbVar2 = *pbVar2 | 1;
                        *(byte *)((long)local_f0 + lVar40) = *(byte *)((long)local_f0 + lVar40) | 8;
                        uVar24 = uVar24 >> 0x1f;
                        *(ulong *)((long)local_e8 + lVar40 + -8) =
                             (ulong)(uVar24 << 10) | *(ulong *)((long)local_e8 + lVar40 + -8) | 0x40
                        ;
                        *(ulong *)((long)local_f0 + lVar40 + -8) =
                             (ulong)(uVar24 << 8) | *(ulong *)((long)local_f0 + lVar40 + -8) | 0x10;
                        *(ulong *)((long)pjVar36 + lVar40 + -0x10) =
                             (ulong)(uVar24 << 9) | *(ulong *)((long)pjVar36 + lVar40 + -0x10) |
                             0x20;
                        *(ulong *)((long)pjVar36 + lVar40) =
                             (ulong)(uVar12 << 0xb) | *(ulong *)((long)pjVar36 + lVar40) | 0x80;
                        uVar20 = *(ulong *)((long)pjVar36 + lVar40 + -8) | 0x1000;
                      }
                      *(ulong *)((long)pjVar36 + lVar40 + -8) = uVar20 | 0x4000;
                    }
                    if (2 < uVar48) {
                      uVar20 = *(ulong *)((long)local_140 + lVar40 + -8);
                      if ((uVar20 & 0x5000) == 0 && (char)uVar20 != '\0') {
                        uVar20 = *(ulong *)((long)local_f8 + lVar40);
                        uVar27 = -uVar20;
                        if (0 < (long)uVar20) {
                          uVar27 = uVar20;
                        }
                        if ((bitstream->openmode_ & 2) == 0) {
                          pcVar39 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012e7ba:
                          __assert_fail(pcVar39,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                        ,0x24e,
                                        "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                       );
                        }
                        iVar13 = bitstream->cnt_;
                        iVar43 = iVar13 + -1;
                        bitstream->cnt_ = iVar43;
                        uVar47 = (uint)((uVar27 & uVar28) != 0);
                        if (iVar13 < 1) {
                          uVar5 = bitstream->buf_;
                          pjVar15 = bitstream->stream_;
                          uVar12 = (uint)uVar5;
                          uVar24 = uVar12 & 0xff;
                          uVar25 = uVar24 == 0xff ^ 7;
                          bitstream->cnt_ = uVar25;
                          bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar25 | uVar24 << 8);
                          uVar47 = pjVar15->flags_;
                          iVar43 = -1;
                          if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                          if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                          goto LAB_0012e565;
                          *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                          iVar13 = pjVar15->cnt_;
                          pjVar15->cnt_ = iVar13 + -1;
                          if (iVar13 < 1) {
                            iVar13 = jas_stream_flushbuf(pjVar15,uVar12 & 0xff);
                            if (iVar13 == -1) goto LAB_0012e56f;
                          }
                          else {
                            pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                            puVar6 = pjVar15->ptr_;
                            pjVar15->ptr_ = puVar6 + 1;
                            *puVar6 = (uchar)uVar5;
                          }
                        }
                        else {
                          bitstream->buf_ =
                               bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar43 & 0x1f));
                        }
                        if ((uVar27 & uVar28) == 0) {
                          uVar20 = *(ulong *)((long)local_140 + lVar40 + -8);
                        }
                        else {
                          uVar20 = *(ulong *)((long)local_f8 + lVar40);
                          uVar27 = -uVar20;
                          if (0 < (long)uVar20) {
                            uVar27 = uVar20;
                          }
                          pjVar21->nmsedec =
                               pjVar21->nmsedec +
                               local_150[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                          if ((bitstream->openmode_ & 2) == 0) {
                            pcVar39 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                            goto LAB_0012e7ba;
                          }
                          uVar4 = *(undefined8 *)((long)local_f8 + lVar40);
                          iVar13 = bitstream->cnt_;
                          iVar43 = iVar13 + -1;
                          bitstream->cnt_ = iVar43;
                          uVar24 = (uint)((ulong)uVar4 >> 0x20);
                          uVar12 = uVar24 >> 0x1f;
                          if (iVar13 < 1) {
                            uVar5 = bitstream->buf_;
                            pjVar15 = bitstream->stream_;
                            uVar47 = (uint)uVar5 & 0xff;
                            uVar25 = uVar47 == 0xff ^ 7;
                            bitstream->cnt_ = uVar25;
                            uVar25 = uVar12 << (sbyte)uVar25 | uVar47 << 8;
                            bitstream->buf_ = (ulong)uVar25;
                            uVar47 = pjVar15->flags_;
                            iVar43 = -1;
                            if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                            if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                            goto LAB_0012e565;
                            *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                            iVar13 = pjVar15->cnt_;
                            pjVar15->cnt_ = iVar13 + -1;
                            if (iVar13 < 1) {
                              iVar13 = jas_stream_flushbuf(pjVar15,uVar25 >> 8);
                              if (iVar13 == -1) goto LAB_0012e56f;
                            }
                            else {
                              pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                              puVar6 = pjVar15->ptr_;
                              pjVar15->ptr_ = puVar6 + 1;
                              *puVar6 = (uchar)uVar5;
                            }
                          }
                          else {
                            bitstream->buf_ =
                                 bitstream->buf_ | (long)(int)(uVar12 << ((byte)iVar43 & 0x1f));
                          }
                          pbVar2 = (byte *)((long)local_b8 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 2;
                          *(byte *)((long)local_b8 + lVar40) =
                               *(byte *)((long)local_b8 + lVar40) | 4;
                          pbVar2 = (byte *)((long)local_d8 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 1;
                          *(byte *)((long)local_d8 + lVar40) =
                               *(byte *)((long)local_d8 + lVar40) | 8;
                          uVar24 = uVar24 >> 0x1f;
                          *(ulong *)((long)local_b8 + lVar40 + -8) =
                               (ulong)(uVar24 << 10) | *(ulong *)((long)local_b8 + lVar40 + -8) |
                               0x40;
                          *(ulong *)((long)local_d8 + lVar40 + -8) =
                               (ulong)(uVar24 << 8) | *(ulong *)((long)local_d8 + lVar40 + -8) |
                               0x10;
                          *(ulong *)((long)local_140 + lVar40 + -0x10) =
                               (ulong)(uVar24 << 9) | *(ulong *)((long)local_140 + lVar40 + -0x10) |
                               0x20;
                          *(ulong *)((long)local_140 + lVar40) =
                               (ulong)(uVar12 << 0xb) | *(ulong *)((long)local_140 + lVar40) | 0x80;
                          uVar20 = *(ulong *)((long)local_140 + lVar40 + -8) | 0x1000;
                        }
                        *(ulong *)((long)local_140 + lVar40 + -8) = uVar20 | 0x4000;
                      }
                      if ((uVar48 != 3) &&
                         (uVar20 = *(ulong *)((long)local_110 + lVar40 + -8),
                         (uVar20 & 0x5000) == 0 && (char)uVar20 != '\0')) {
                        uVar20 = *(ulong *)((long)local_d0 + lVar40);
                        uVar27 = -uVar20;
                        if (0 < (long)uVar20) {
                          uVar27 = uVar20;
                        }
                        if ((bitstream->openmode_ & 2) == 0) {
                          pcVar39 = "((out))->openmode_ & JPC_BITSTREAM_WRITE";
LAB_0012e7e2:
                          __assert_fail(pcVar39,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                                        ,0x256,
                                        "int jpc_encrawsigpass(jpc_bitstream_t *, int, int, jas_matrix_t *, jas_matrix_t *, int, long *)"
                                       );
                        }
                        iVar13 = bitstream->cnt_;
                        iVar43 = iVar13 + -1;
                        bitstream->cnt_ = iVar43;
                        uVar47 = (uint)((uVar27 & uVar28) != 0);
                        if (iVar13 < 1) {
                          uVar5 = bitstream->buf_;
                          pjVar15 = bitstream->stream_;
                          uVar12 = (uint)uVar5;
                          uVar24 = uVar12 & 0xff;
                          uVar25 = uVar24 == 0xff ^ 7;
                          bitstream->cnt_ = uVar25;
                          bitstream->buf_ = (ulong)(uVar47 << (sbyte)uVar25 | uVar24 << 8);
                          uVar47 = pjVar15->flags_;
                          iVar43 = -1;
                          if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                          if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                          goto LAB_0012e565;
                          *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                          iVar13 = pjVar15->cnt_;
                          pjVar15->cnt_ = iVar13 + -1;
                          if (iVar13 < 1) {
                            iVar13 = jas_stream_flushbuf(pjVar15,uVar12 & 0xff);
                            if (iVar13 == -1) goto LAB_0012e56f;
                          }
                          else {
                            pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                            puVar6 = pjVar15->ptr_;
                            pjVar15->ptr_ = puVar6 + 1;
                            *puVar6 = (uchar)uVar5;
                          }
                        }
                        else {
                          bitstream->buf_ =
                               bitstream->buf_ | (long)(int)(uVar47 << ((byte)iVar43 & 0x1f));
                        }
                        if ((uVar27 & uVar28) == 0) {
                          uVar20 = *(ulong *)((long)local_110 + lVar40 + -8);
                        }
                        else {
                          uVar20 = *(ulong *)((long)local_d0 + lVar40);
                          uVar27 = -uVar20;
                          if (0 < (long)uVar20) {
                            uVar27 = uVar20;
                          }
                          pjVar21->nmsedec =
                               pjVar21->nmsedec +
                               local_150[(uint)(uVar27 >> (bVar23 & 0x3f)) & 0x7f];
                          if ((bitstream->openmode_ & 2) == 0) {
                            pcVar39 = "(out)->openmode_ & JPC_BITSTREAM_WRITE";
                            goto LAB_0012e7e2;
                          }
                          uVar4 = *(undefined8 *)((long)local_d0 + lVar40);
                          iVar13 = bitstream->cnt_;
                          iVar43 = iVar13 + -1;
                          bitstream->cnt_ = iVar43;
                          uVar24 = (uint)((ulong)uVar4 >> 0x20);
                          uVar12 = uVar24 >> 0x1f;
                          if (iVar13 < 1) {
                            uVar5 = bitstream->buf_;
                            pjVar15 = bitstream->stream_;
                            uVar47 = (uint)uVar5 & 0xff;
                            uVar25 = uVar47 == 0xff ^ 7;
                            bitstream->cnt_ = uVar25;
                            uVar25 = uVar12 << (sbyte)uVar25 | uVar47 << 8;
                            bitstream->buf_ = (ulong)uVar25;
                            uVar47 = pjVar15->flags_;
                            iVar43 = -1;
                            if ((uVar47 & 7) != 0) goto LAB_0012e56b;
                            if ((-1 < pjVar15->rwlimit_) && (pjVar15->rwlimit_ <= pjVar15->rwcnt_))
                            goto LAB_0012e565;
                            *(byte *)&pjVar15->bufmode_ = (byte)pjVar15->bufmode_ | 0x20;
                            iVar13 = pjVar15->cnt_;
                            pjVar15->cnt_ = iVar13 + -1;
                            if (iVar13 < 1) {
                              iVar13 = jas_stream_flushbuf(pjVar15,uVar25 >> 8);
                              if (iVar13 == -1) goto LAB_0012e56f;
                            }
                            else {
                              pjVar15->rwcnt_ = pjVar15->rwcnt_ + 1;
                              puVar6 = pjVar15->ptr_;
                              pjVar15->ptr_ = puVar6 + 1;
                              *puVar6 = (uchar)uVar5;
                            }
                          }
                          else {
                            bitstream->buf_ =
                                 bitstream->buf_ | (long)(int)(uVar12 << ((byte)iVar43 & 0x1f));
                          }
                          pbVar2 = (byte *)((long)local_98 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 2;
                          *(byte *)((long)local_98 + lVar40) =
                               *(byte *)((long)local_98 + lVar40) | 4;
                          pbVar2 = (byte *)((long)local_a0 + lVar40 + -0x10);
                          *pbVar2 = *pbVar2 | 1;
                          *(byte *)((long)local_a0 + lVar40) =
                               *(byte *)((long)local_a0 + lVar40) | 8;
                          uVar24 = uVar24 >> 0x1f;
                          *(ulong *)((long)local_98 + lVar40 + -8) =
                               (ulong)(uVar24 << 10) | *(ulong *)((long)local_98 + lVar40 + -8) |
                               0x40;
                          *(ulong *)((long)local_a0 + lVar40 + -8) =
                               (ulong)(uVar24 << 8) | *(ulong *)((long)local_a0 + lVar40 + -8) |
                               0x10;
                          *(ulong *)((long)local_110 + lVar40 + -0x10) =
                               (ulong)(uVar24 << 9) | *(ulong *)((long)local_110 + lVar40 + -0x10) |
                               0x20;
                          *(ulong *)((long)local_110 + lVar40) =
                               (ulong)(uVar12 << 0xb) | *(ulong *)((long)local_110 + lVar40) | 0x80;
                          uVar20 = *(ulong *)((long)local_110 + lVar40 + -8) | 0x1000;
                        }
                        *(ulong *)((long)local_110 + lVar40 + -8) = uVar20 | 0x4000;
                      }
                    }
                  }
                  iVar11 = iVar11 + -1;
                  lVar40 = lVar40 + 8;
                } while (1 < iVar11);
              }
              pjVar37 = pjVar37 + iVar8;
              local_100 = local_100 + iVar8;
              local_f8 = local_f8 + iVar8;
              local_d0 = local_d0 + iVar8;
              pjVar33 = pjVar33 + iVar38;
              local_128 = local_128 + iVar38;
              pjVar26 = pjVar26 + iVar38;
              pjVar36 = pjVar36 + iVar38;
              local_f0 = local_f0 + iVar38;
              local_e8 = local_e8 + iVar38;
              local_140 = local_140 + iVar38;
              local_d8 = local_d8 + iVar38;
              local_b8 = local_b8 + iVar38;
              local_110 = local_110 + iVar38;
              local_a0 = local_a0 + iVar38;
              local_98 = local_98 + iVar38;
              uVar20 = (ulong)(uVar48 - 4);
            } while (4 < (int)uVar48);
          }
        }
        if (iVar45 != 0) {
          jpc_bitstream_outalign(bitstream,0x2a);
        }
      }
      if (pjVar21->type == 1) {
        pjVar16 = cblk->mqenc;
        if (pjVar21->term != 0) {
          jpc_mqenc_init(pjVar16);
          pjVar16 = cblk->mqenc;
        }
        jpc_mqenc_getstate(pjVar16,&pjVar21->mqencstate);
        lVar40 = jas_stream_tell(cblk->stream);
        pjVar21->end = (int)lVar40;
        if ((tcmpt->cblksty & 2) != 0) {
          jpc_mqenc_setctxs(cblk->mqenc,0x13,jpc_mqctxs);
        }
      }
      else if (pjVar21->term == 0) {
        lVar40 = jas_stream_tell(cblk->stream);
        iVar45 = jpc_bitstream_pending(bitstream);
        pjVar21->end = (int)lVar40 + iVar45;
      }
      else {
        iVar45 = jpc_bitstream_pending(bitstream);
        if (iVar45 != 0) {
          jpc_bitstream_outalign(bitstream,0x2a);
        }
        jpc_bitstream_close(bitstream);
        lVar40 = jas_stream_tell(cblk->stream);
        pjVar21->end = (int)lVar40;
        bitstream = (jpc_bitstream_t *)0x0;
      }
      dVar51 = (double)band->rlvl->tcmpt->synweight * 0.0001220703125;
      dVar52 = (double)band->synweight * 0.0001220703125;
      dVar53 = (double)band->absstepsize * 0.0001220703125;
      dVar54 = (double)(1 << (bVar23 & 0x1f));
      dVar51 = (double)pjVar21->nmsedec * 0.0001220703125 *
               dVar51 * dVar51 * dVar52 * dVar52 * dVar53 * dVar53 * dVar54 * dVar54;
      pjVar21->wmsedec = dVar51;
      pjVar21->cumwmsedec = dVar51;
      pjVar17 = *ppjVar1;
      if (pjVar21 != pjVar17) {
        pjVar21->cumwmsedec = dVar51 + pjVar21[-1].cumwmsedec;
      }
      local_134 = local_134 - (uint)(lVar34 == 2);
      pjVar21 = pjVar21 + 1;
      bVar50 = 1 < (int)uVar14;
      uVar14 = uVar14 - 1;
    } while (bVar50);
  }
  if (pjVar17 == (jpc_enc_pass_t *)0x0) {
    pjVar21 = (jpc_enc_pass_t *)0x0;
  }
  else {
    pjVar21 = pjVar17 + cblk->numpasses;
  }
  if (pjVar17 != pjVar21) {
    iVar45 = 0;
    do {
      if (pjVar17->start < iVar45) {
        pjVar17->start = iVar45;
      }
      iVar7 = pjVar17->end;
      if (pjVar17->end < iVar45) {
        pjVar17->end = iVar45;
        iVar7 = iVar45;
      }
      if (pjVar17->term == 0) {
        pjVar22 = pjVar17;
        if ((ulong)cblk->numpasses != 0) {
          lVar34 = 0x48;
          do {
            if (pjVar22->term != 0) break;
            pjVar22 = pjVar22 + 1;
            lVar40 = lVar34 >> 3;
            lVar34 = lVar34 + 0x48;
          } while (lVar40 * -0x71c71c71c71c71c7 < (long)(ulong)cblk->numpasses);
        }
        if (pjVar17->type == 1) {
          bVar50 = (pjVar17->mqencstate).lastbyte == 0xff;
          iVar8 = bVar50 + 5;
          if (4 < (pjVar17->mqencstate).ctreg) {
            iVar8 = bVar50 + 4;
          }
          iVar7 = iVar8 + iVar7;
          pjVar17->end = iVar7;
        }
        iVar8 = pjVar22->end;
        if (iVar8 < iVar7) {
          pjVar17->end = iVar8;
          iVar7 = iVar8;
        }
        pjVar15 = cblk->stream;
        lVar34 = jas_stream_tell(pjVar15);
        if (lVar34 < 0) {
          __assert_fail("oldpos >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_t1enc.c"
                        ,0xb5,"int getthebyte(jas_stream_t *, long)");
        }
        jas_stream_seek(pjVar15,(long)(iVar7 + -1),0);
        if (pjVar15->cnt_ < 1) {
          uVar14 = jas_stream_fillbuf(pjVar15,0);
        }
        else {
          uVar14 = (uint)*pjVar15->ptr_;
        }
        jas_stream_seek(pjVar15,lVar34,0);
        if (uVar14 == 0xff) {
          iVar7 = pjVar17->end + 1;
          pjVar17->end = iVar7;
        }
        else {
          if (uVar14 == 0xffffffff) {
            abort();
          }
          iVar7 = pjVar17->end;
        }
      }
      if (iVar45 <= iVar7) {
        iVar45 = iVar7;
      }
      pjVar17 = pjVar17 + 1;
    } while (pjVar17 != pjVar21);
  }
  iVar43 = 0;
LAB_0012e55e:
  if (bitstream == (jpc_bitstream_t *)0x0) {
    return iVar43;
  }
LAB_0012e56f:
  jpc_bitstream_close(bitstream);
  return iVar43;
LAB_0012e565:
  pjVar15->flags_ = uVar47 | 4;
LAB_0012e56b:
  iVar43 = -1;
  goto LAB_0012e56f;
}

Assistant:

int jpc_enc_enccblk(jpc_enc_tcmpt_t *tcmpt, jpc_enc_band_t *band, jpc_enc_cblk_t *cblk)
{
	jpc_enc_pass_t *pass;
	jpc_enc_pass_t *endpasses;
	int bitpos;
	int n;
	int adjust;
	int ret;
	int passtype;
	int t;
	jpc_bitstream_t *bout;
	jpc_enc_pass_t *termpass;
	int vcausal;
	int segsym;
	int termmode;
	int c;

	bout = 0;

	cblk->stream = jas_stream_memopen(0, 0);
	assert(cblk->stream);
	cblk->mqenc = jpc_mqenc_create(JPC_NUMCTXS, cblk->stream);
	assert(cblk->mqenc);
	jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);

	cblk->numpasses = (cblk->numbps > 0) ? (3 * cblk->numbps - 2) : 0;
	if (cblk->numpasses > 0) {
		cblk->passes = jas_alloc2(cblk->numpasses, sizeof(jpc_enc_pass_t));
		assert(cblk->passes);
	} else {
		cblk->passes = 0;
	}
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		pass->start = 0;
		pass->end = 0;
		pass->term = JPC_ISTERMINATED(pass - cblk->passes, 0, cblk->numpasses, (tcmpt->cblksty & JPC_COX_TERMALL) != 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->type = JPC_SEGTYPE(pass - cblk->passes, 0, (tcmpt->cblksty & JPC_COX_LAZY) != 0);
		pass->lyrno = -1;
if (pass == endpasses - 1) {
assert(pass->term == 1);
	pass->term = 1;
}
	}

	cblk->flags = jas_matrix_create(jas_matrix_numrows(cblk->data) + 2,
	  jas_matrix_numcols(cblk->data) + 2);
	assert(cblk->flags);


	bitpos = cblk->numbps - 1;
	pass = cblk->passes;
	n = cblk->numpasses;
	while (--n >= 0) {

		if (pass->type == JPC_SEG_MQ) {
			/* NOP */
		} else {
			assert(pass->type == JPC_SEG_RAW);
			if (!bout) {
				bout = jpc_bitstream_sopen(cblk->stream, "w");
				if (!bout)
					return -1;
			}
		}

#if 1
		passtype = (pass - cblk->passes + 2) % 3;
#else
		passtype = JPC_PASSTYPE(pass - cblk->passes + 2);
#endif
		pass->start = jas_stream_tell(cblk->stream);
#if 0
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif
		assert(bitpos >= 0);
		vcausal = (tcmpt->cblksty & JPC_COX_VSC) != 0;
		segsym = (tcmpt->cblksty & JPC_COX_SEGSYM) != 0;
		if (pass->term) {
			termmode = ((tcmpt->cblksty & JPC_COX_PTERM) ?
			  JPC_MQENC_PTERM : JPC_MQENC_DEFTERM) + 1;
		} else {
			termmode = 0;
		}
		switch (passtype) {
		case JPC_SIGPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encsigpass(cblk->mqenc,
			  bitpos, band->orient, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec) :
			  jpc_encrawsigpass(bout, bitpos, vcausal, cblk->flags,
			  cblk->data, termmode, &pass->nmsedec);
			break;
		case JPC_REFPASS:
			ret = (pass->type == JPC_SEG_MQ) ? jpc_encrefpass(cblk->mqenc,
			  bitpos, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec) : jpc_encrawrefpass(bout, bitpos,
			  cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		case JPC_CLNPASS:
			assert(pass->type == JPC_SEG_MQ);
			ret = jpc_encclnpass(cblk->mqenc, bitpos, band->orient,
			  vcausal, segsym, cblk->flags, cblk->data, termmode,
			  &pass->nmsedec);
			break;
		default:
			assert(0);
			break;
		}

		if (ret) {
			if (bout) {
				jpc_bitstream_close(bout);
			}
			return -1;
		}

		if (pass->type == JPC_SEG_MQ) {
			if (pass->term) {
				jpc_mqenc_init(cblk->mqenc);
			}
			jpc_mqenc_getstate(cblk->mqenc, &pass->mqencstate);
			pass->end = jas_stream_tell(cblk->stream);
			if (tcmpt->cblksty & JPC_COX_RESET) {
				jpc_mqenc_setctxs(cblk->mqenc, JPC_NUMCTXS, jpc_mqctxs);
			}
		} else {
			if (pass->term) {
				if (jpc_bitstream_pending(bout)) {
					jpc_bitstream_outalign(bout, 0x2a);
				}
				jpc_bitstream_close(bout);
				bout = 0;
				pass->end = jas_stream_tell(cblk->stream);
			} else {
				pass->end = jas_stream_tell(cblk->stream) +
				  jpc_bitstream_pending(bout);
/* NOTE - This will not work.  need to adjust by # of pending output bytes */
			}
		}
#if 0
/* XXX - This assertion fails sometimes when various coding modes are used.
This seems to be harmless, but why does it happen at all? */
assert(jas_stream_tell(cblk->stream) == jas_stream_getrwcount(cblk->stream));
#endif

		pass->wmsedec = jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->rlvl->tcmpt->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->synweight) *
		  jpc_fixtodbl(band->absstepsize) * jpc_fixtodbl(band->absstepsize) *
		  ((double) (1 << bitpos)) * ((double)(1 << bitpos)) *
		  jpc_fixtodbl(pass->nmsedec);
		pass->cumwmsedec = pass->wmsedec;
		if (pass != cblk->passes) {
			pass->cumwmsedec += pass[-1].cumwmsedec;
		}
		if (passtype == JPC_CLNPASS) {
			--bitpos;
		}
		++pass;
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	n = 0;
	endpasses = (cblk->passes) ? &cblk->passes[cblk->numpasses] : 0;
	for (pass = cblk->passes; pass != endpasses; ++pass) {
		if (pass->start < n) {
			pass->start = n;
		}
		if (pass->end < n) {
			pass->end = n;
		}
		if (!pass->term) {
			termpass = pass;
			while (termpass - pass < cblk->numpasses &&
			  !termpass->term) {
				++termpass;
			}
			if (pass->type == JPC_SEG_MQ) {
				t = (pass->mqencstate.lastbyte == 0xff) ? 1 : 0;
				if (pass->mqencstate.ctreg >= 5) {
					adjust = 4 + t;
				} else {
					adjust = 5 + t;
				}
				pass->end += adjust;
			}
			if (pass->end > termpass->end) {
				pass->end = termpass->end;
			}
			if ((c = getthebyte(cblk->stream, pass->end - 1)) == EOF) {
				abort();
			}
			if (c == 0xff) {
				++pass->end;
			}
			n = JAS_MAX(n, pass->end);
		} else {
			n = JAS_MAX(n, pass->end);
		}
	}

#if 0
dump_passes(cblk->passes, cblk->numpasses, cblk);
#endif

	if (bout) {
		jpc_bitstream_close(bout);
	}

	return 0;
}